

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

file_time_type ghc::filesystem::last_write_time(path *p)

{
  bool bVar1;
  int code;
  file_time_type fVar2;
  filesystem_error *this;
  error_code ec_00;
  string local_48;
  undefined1 auStack_28 [8];
  error_code ec;
  path *p_local;
  file_time_type result;
  
  ec._M_cat = (error_category *)p;
  std::error_code::error_code((error_code *)auStack_28);
  fVar2 = last_write_time((path *)ec._M_cat,(error_code *)auStack_28);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_28);
  if (!bVar1) {
    return (duration)fVar2.__d.__r;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  code = std::error_code::value((error_code *)auStack_28);
  detail::systemErrorText<int>(&local_48,code);
  ec_00._0_8_ = (ulong)auStack_28 & 0xffffffff;
  ec_00._M_cat = (error_category *)ec._0_8_;
  filesystem_error::filesystem_error(this,&local_48,(path *)ec._M_cat,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE file_time_type last_write_time(const path& p)
{
    std::error_code ec;
    auto result = last_write_time(p, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
    return result;
}